

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *tab_bar_00;
  ImU32 tab_id_00;
  ImGuiTabItem *pIVar1;
  bool bVar2;
  ImGuiTabItem *tab;
  ImGuiID tab_id;
  ImGuiTabBar *tab_bar;
  bool is_within_manual_tab_bar;
  ImGuiContext *g;
  char *label_local;
  
  bVar2 = false;
  if (GImGui->CurrentTabBar != (ImGuiTabBar *)0x0) {
    bVar2 = (GImGui->CurrentTabBar->Flags & 0x100000U) == 0;
  }
  if (bVar2) {
    tab_bar_00 = GImGui->CurrentTabBar;
    tab_id_00 = TabBarCalcTabID(tab_bar_00,label);
    pIVar1 = TabBarFindTabByID(tab_bar_00,tab_id_00);
    if (pIVar1 != (ImGuiTabItem *)0x0) {
      pIVar1->WantClose = true;
    }
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
}